

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O0

void msd_CE2_16bit(uchar **strings,size_t n,size_t depth)

{
  ushort uVar1;
  uchar *puVar2;
  undefined8 uVar3;
  void *__ptr;
  ulong local_468;
  size_t i_4;
  size_t bsum;
  size_t i_3;
  size_t i_2;
  uint16_t bucketindex [256];
  uchar **sorted;
  size_t i_1;
  size_t i;
  uchar *oracle;
  uint16_t bucketsize [256];
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
  }
  else {
    memset(&oracle,0,0x200);
    __ptr = malloc(n);
    for (i_1 = 0; i_1 < n; i_1 = i_1 + 1) {
      *(uchar *)((long)__ptr + i_1) = strings[i_1][depth];
    }
    for (sorted = (uchar **)0x0; sorted < n; sorted = (uchar **)((long)sorted + 1)) {
      bucketsize[(ulong)*(byte *)((long)__ptr + (long)sorted) - 4] =
           bucketsize[(ulong)*(byte *)((long)__ptr + (long)sorted) - 4] + 1;
    }
    bucketindex._504_8_ = malloc(n << 3);
    for (i_3 = 1; i_3 < 0x100; i_3 = i_3 + 1) {
      bucketindex[i_3 - 4] = bucketindex[i_3 - 5] + bucketsize[i_3 - 5];
    }
    for (bsum = 0; uVar3 = bucketindex._504_8_, bsum < n; bsum = bsum + 1) {
      puVar2 = strings[bsum];
      uVar1 = bucketindex[(ulong)*(byte *)((long)__ptr + bsum) - 4];
      bucketindex[(ulong)*(byte *)((long)__ptr + bsum) - 4] = uVar1 + 1;
      *(uchar **)(uVar3 + (ulong)uVar1 * 8) = puVar2;
    }
    memcpy(strings,(void *)bucketindex._504_8_,n << 3);
    free((void *)bucketindex._504_8_);
    free(__ptr);
    i_4 = (size_t)(ushort)oracle;
    for (local_468 = 1; local_468 < 0x100; local_468 = local_468 + 1) {
      if (bucketsize[local_468 - 4] != 0) {
        msd_CE2_16bit(strings + i_4,(ulong)bucketsize[local_468 - 4],depth + 1);
        i_4 = bucketsize[local_468 - 4] + i_4;
      }
    }
  }
  return;
}

Assistant:

void
msd_CE2_16bit(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	uint16_t bucketsize[256] = {0};
	unsigned char* restrict oracle =
		(unsigned char*) malloc(n);
	for (size_t i=0; i < n; ++i)
		oracle[i] = strings[i][depth];
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	unsigned char** restrict sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	uint16_t bucketindex[256];
	bucketindex[0] = 0;
	for (size_t i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	free(sorted);
	free(oracle);
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_CE2_16bit(strings+bsum, bucketsize[i], depth+1);
		bsum += bucketsize[i];
	}
}